

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::Boxed_Number::boolean_go<unsigned_char>
          (Boxed_Number *this,Opers t_oper,uchar *t,uchar *u)

{
  bad_any_cast *this_00;
  bool b;
  Boxed_Value BVar1;
  
  switch(t_oper) {
  case equals:
    b = *t == *u;
    break;
  case less_than:
    b = *t < *u;
    break;
  case greater_than:
    b = *u < *t;
    break;
  case less_than_equal:
    b = *t <= *u;
    break;
  case greater_than_equal:
    b = *u <= *t;
    break;
  case not_equal:
    b = *t != *u;
    break;
  default:
    this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
    detail::exception::bad_any_cast::bad_any_cast(this_00);
    __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  }
  BVar1 = const_var((chaiscript *)this,b);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value boolean_go(Operators::Opers t_oper, const T &t, const T &u)
      {
        switch (t_oper)
        {
          case Operators::equals:
            return const_var(t == u);
          case Operators::less_than:
            return const_var(t < u);
          case Operators::greater_than:
            return const_var(t > u);
          case Operators::less_than_equal:
            return const_var(t <= u);
          case Operators::greater_than_equal:
            return const_var(t >= u);
          case Operators::not_equal:
            return const_var(t != u);
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }
      }